

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_writemap.cpp
# Opt level: O1

void Cmd_dumpmap(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  char *__filename;
  FILE *__stream;
  long lVar4;
  FTexture *pFVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  wadinfo_t header;
  wadlump_t lumps [12];
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_118;
  undefined2 local_114;
  undefined2 local_112;
  undefined2 local_110;
  short local_10c;
  undefined8 local_108;
  undefined4 local_100;
  undefined8 local_f8;
  char local_f0 [8];
  undefined4 local_e8;
  undefined8 local_e4;
  undefined2 local_dc;
  undefined4 local_d8;
  int local_d4;
  undefined8 local_d0;
  undefined4 local_c8;
  int local_c4;
  undefined8 local_c0;
  undefined4 local_b8;
  int local_b4;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_a4;
  undefined4 local_98;
  undefined4 local_94;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_84;
  undefined1 local_7c;
  undefined4 local_78;
  int local_74;
  undefined4 local_70;
  undefined3 uStack_6c;
  undefined4 local_68;
  undefined8 local_64;
  undefined2 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_40;
  
  uStack_130 = 0x55d475;
  iVar3 = FCommandLine::argc(argv);
  if (iVar3 < 2) {
    pcVar7 = "Usage: dumpmap <wadname> [mapname]\n";
  }
  else {
    if (gamestate == GS_LEVEL) {
      uStack_130 = 0x55d4b6;
      iVar3 = FCommandLine::argc(argv);
      if (iVar3 < 3) {
        pcVar7 = "MAP01";
        if (((byte)gameinfo.flags & 1) == 0) {
          pcVar7 = "E1M1";
        }
      }
      else {
        uStack_130 = 0x55d4e6;
        pcVar7 = FCommandLine::operator[](argv,2);
      }
      uStack_130 = 0x55d4f6;
      __filename = FCommandLine::operator[](argv,1);
      uStack_130 = 0x55d505;
      __stream = fopen(__filename,"wb");
      if (__stream == (FILE *)0x0) {
        uStack_130 = 0x55dbb9;
        pcVar7 = FCommandLine::operator[](argv,1);
        Printf("Cannot write %s\n",pcVar7);
        return;
      }
      local_100 = 0;
      local_108 = 0xc44415750;
      uStack_130 = 0x55d53a;
      memset(&local_f8,0,0xc0);
      uStack_130 = 0x55d549;
      fseek(__stream,0xc,0);
      local_f8 = 0xc;
      uStack_130 = 0x55d560;
      uppercopy(local_f0,pcVar7);
      uStack_130 = 0x55d568;
      lVar4 = ftell(__stream);
      local_e8 = (undefined4)lVar4;
      local_118 = 0;
      lVar4 = (&players)[(long)consoleplayer * 0x54];
      local_128._0_4_ = (int)*(double *)(lVar4 + 0x48) << 0x10;
      local_128._0_6_ = CONCAT24((short)(int)*(double *)(lVar4 + 0x50),(int)local_128);
      local_128 = (ulong)(uint6)local_128;
      uStack_120._0_6_ = CONCAT42(0x1e70001,(short)(int)*(double *)(lVar4 + 0x90));
      uStack_120 = (ulong)(uint6)uStack_120;
      uStack_130 = 0x55d5cd;
      fwrite(&local_128,0x14,1,__stream);
      local_e4 = 0x4e49485400000014;
      local_dc = 0x5347;
      uStack_130 = 0x55d5ea;
      lVar4 = ftell(__stream);
      local_d8 = (undefined4)lVar4;
      if (0 < numlines) {
        lVar8 = 0;
        lVar4 = 0;
        do {
          uVar2 = local_128;
          local_128._0_4_ =
               CONCAT22((short)((uint)(*(int *)&lines[lVar4].v2 - (int)vertexes) >> 3) * 0x6db7,
                        (short)((uint)(*(int *)&lines[lVar4].v1 - (int)vertexes) >> 3) * 0x6db7);
          local_128._0_6_ = CONCAT24((short)lines[lVar4].flags,(int)local_128);
          local_128._7_1_ = SUB81(uVar2,7);
          local_128._0_7_ = CONCAT16((char)lines[lVar4].special,(uint6)local_128);
          lVar6 = 0xb;
          do {
            *(undefined1 *)((long)&uStack_130 + lVar6 + 4) =
                 *(undefined1 *)((long)lines->args + lVar6 * 4 + lVar8 + -0x2c);
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x10);
          uStack_120._0_6_ =
               CONCAT24((short)((uint)(*(int *)lines[lVar4].sidedef - (int)sides) >> 3) * -0x25ed,
                        (undefined4)uStack_120);
          uStack_120 = CONCAT26((short)((uint)(*(int *)(lines[lVar4].sidedef + 1) - (int)sides) >> 3
                                       ) * -0x25ed,(uint6)uStack_120);
          uStack_130 = 0x55d6c1;
          fwrite(&local_128,0x10,1,__stream);
          lVar4 = lVar4 + 1;
          lVar8 = lVar8 + 0x98;
        } while (lVar4 < numlines);
      }
      local_d4 = numlines << 4;
      local_d0 = 0x53464544454e494c;
      uStack_130 = 0x55d6ff;
      lVar4 = ftell(__stream);
      local_c8 = (undefined4)lVar4;
      if (0 < numsides) {
        lVar8 = 0;
        lVar4 = 0;
        do {
          lVar6 = CONCAT44(sides._4_4_,(int)sides);
          local_128._0_4_ =
               CONCAT22((short)(int)*(double *)(lVar6 + 0x48 + lVar8),
                        (short)(int)*(double *)(lVar6 + 0x40 + lVar8));
          local_10c = (short)((uint)(*(int *)(lVar6 + lVar8) - (int)sectors) >> 3) * 0x3885;
          uVar1 = *(uint *)(lVar6 + 0x30 + lVar8);
          if (uVar1 < TexMan.Textures.Count) {
            pFVar5 = TexMan.Textures.Array[(int)uVar1].Texture;
          }
          else {
            pFVar5 = (FTexture *)0x0;
          }
          pcVar7 = "-";
          if (pFVar5 != (FTexture *)0x0) {
            pcVar7 = (pFVar5->Name).Chars;
          }
          uStack_130 = 0x55d794;
          uppercopy((char *)((long)&local_128 + 4),pcVar7);
          uVar1 = *(uint *)(CONCAT44(sides._4_4_,(int)sides) + 0x90 + lVar8);
          if (uVar1 < TexMan.Textures.Count) {
            pFVar5 = TexMan.Textures.Array[(int)uVar1].Texture;
          }
          else {
            pFVar5 = (FTexture *)0x0;
          }
          pcVar7 = "-";
          if (pFVar5 != (FTexture *)0x0) {
            pcVar7 = (pFVar5->Name).Chars;
          }
          uStack_130 = 0x55d7ca;
          uppercopy((char *)((long)&uStack_120 + 4),pcVar7);
          uVar1 = *(uint *)(CONCAT44(sides._4_4_,(int)sides) + 0x60 + lVar8);
          if (uVar1 < TexMan.Textures.Count) {
            pFVar5 = TexMan.Textures.Array[(int)uVar1].Texture;
          }
          else {
            pFVar5 = (FTexture *)0x0;
          }
          pcVar7 = "-";
          if (pFVar5 != (FTexture *)0x0) {
            pcVar7 = (pFVar5->Name).Chars;
          }
          uStack_130 = 0x55d7fd;
          uppercopy((char *)&local_114,pcVar7);
          uStack_130 = 0x55d812;
          fwrite(&local_128,0x1e,1,__stream);
          lVar4 = lVar4 + 1;
          lVar8 = lVar8 + 0xd8;
        } while (lVar4 < numsides);
      }
      local_c4 = numsides * 0x1e;
      local_c0 = 0x5346454445444953;
      uStack_130 = 0x55d852;
      lVar4 = ftell(__stream);
      local_b8 = (undefined4)lVar4;
      if (0 < numvertexes) {
        lVar4 = 8;
        lVar8 = 0;
        do {
          local_128._0_4_ =
               CONCAT22((short)((ulong)(*(double *)(CONCAT44(vertexes._4_4_,(int)vertexes) + lVar4)
                                       + 103079215104.0) >> 0x10),
                        (short)((ulong)(*(double *)
                                         (CONCAT44(vertexes._4_4_,(int)vertexes) + -8 + lVar4) +
                                       103079215104.0) >> 0x10));
          uStack_130 = 0x55d8c6;
          fwrite(&local_128,4,1,__stream);
          lVar8 = lVar8 + 1;
          lVar4 = lVar4 + 0x38;
        } while (lVar8 < numvertexes);
      }
      local_b4 = numvertexes << 2;
      local_b0 = 0x5345584554524556;
      uStack_130 = 0x55d8f3;
      lVar4 = ftell(__stream);
      local_a8 = (undefined4)lVar4;
      local_a4 = 0x5347455300000000;
      uStack_130 = 0x55d914;
      lVar4 = ftell(__stream);
      local_98 = (undefined4)lVar4;
      local_94 = 0;
      local_90 = 0x53524f5443455353;
      uStack_130 = 0x55d940;
      lVar4 = ftell(__stream);
      local_88 = (undefined4)lVar4;
      local_84 = 0x45444f4e00000000;
      local_7c = 0x53;
      uStack_130 = 0x55d969;
      lVar4 = ftell(__stream);
      local_78 = (undefined4)lVar4;
      if (0 < numsectors) {
        lVar8 = 0;
        lVar4 = 0;
        do {
          lVar6 = CONCAT44(sectors._4_4_,(int)sectors);
          local_128._0_4_ =
               CONCAT22((short)(int)*(double *)(lVar6 + 0xa8 + lVar8),
                        (short)(int)*(double *)(lVar6 + 0x50 + lVar8));
          uVar1 = *(uint *)(lVar6 + 0x48 + lVar8);
          if (uVar1 < TexMan.Textures.Count) {
            pFVar5 = TexMan.Textures.Array[(int)uVar1].Texture;
          }
          else {
            pFVar5 = (FTexture *)0x0;
          }
          pcVar7 = "-";
          if (pFVar5 != (FTexture *)0x0) {
            pcVar7 = (pFVar5->Name).Chars;
          }
          uStack_130 = 0x55d9ea;
          uppercopy((char *)((long)&local_128 + 4),pcVar7);
          uVar1 = *(uint *)(CONCAT44(sectors._4_4_,(int)sectors) + 0xa0 + lVar8);
          if (uVar1 < TexMan.Textures.Count) {
            pFVar5 = TexMan.Textures.Array[(int)uVar1].Texture;
          }
          else {
            pFVar5 = (FTexture *)0x0;
          }
          pcVar7 = "-";
          if (pFVar5 != (FTexture *)0x0) {
            pcVar7 = (pFVar5->Name).Chars;
          }
          uStack_130 = 0x55da21;
          uppercopy((char *)((long)&uStack_120 + 4),pcVar7);
          lVar6 = CONCAT44(sectors._4_4_,(int)sectors);
          local_114 = *(undefined2 *)(lVar6 + 0x112 + lVar8);
          local_112 = *(undefined2 *)(lVar6 + 0x110 + lVar8);
          uStack_130 = 0x55da51;
          iVar3 = FTagManager::GetFirstSectorTag(&tagManager,(sector_t *)(lVar6 + lVar8));
          local_110 = (undefined2)iVar3;
          uStack_130 = 0x55da6b;
          fwrite(&local_128,0x1a,1,__stream);
          lVar4 = lVar4 + 1;
          lVar8 = lVar8 + 0x268;
        } while (lVar4 < numsectors);
      }
      local_74 = numsectors * 0x1a;
      local_70 = 0x54434553;
      uStack_6c = 0x53524f;
      uStack_130 = 0x55daba;
      lVar4 = ftell(__stream);
      local_68 = (undefined4)lVar4;
      local_64 = 0x454a455200000000;
      local_5c = 0x5443;
      uStack_130 = 0x55dae4;
      lVar4 = ftell(__stream);
      local_58 = (undefined4)lVar4;
      local_54 = 0;
      local_50 = 0x50414d4b434f4c42;
      uStack_130 = 0x55db0f;
      lVar4 = ftell(__stream);
      local_48 = (undefined4)lVar4;
      uStack_130 = 0x55db2f;
      fwrite(WriteBEHAVIOR(_IO_FILE*)::dummy,0x10,1,__stream);
      local_44 = 0x10;
      local_40 = 0x524f495641484542;
      uStack_130 = 0x55db53;
      lVar4 = ftell(__stream);
      local_100 = (undefined4)lVar4;
      uStack_130 = 0x55db71;
      fwrite(&local_f8,0x10,0xc,__stream);
      uStack_130 = 0x55db7d;
      fseek(__stream,0,0);
      uStack_130 = 0x55db92;
      fwrite(&local_108,0xc,1,__stream);
      uStack_130 = 0x55db9a;
      fclose(__stream);
      return;
    }
    pcVar7 = "You can only dump a map when inside a level.\n";
  }
  Printf(pcVar7);
  return;
}

Assistant:

CCMD (dumpmap)
{
	const char *mapname;
	FILE *file;

	if (argv.argc() < 2)
	{
		Printf ("Usage: dumpmap <wadname> [mapname]\n");
		return;
	}
	
	if (gamestate != GS_LEVEL)
	{
		Printf ("You can only dump a map when inside a level.\n");
		return;
	}

	if (argv.argc() < 3)
	{
		if (gameinfo.flags & GI_MAPxx)
		{
			mapname = "MAP01";
		}
		else
		{
			mapname = "E1M1";
		}
	}
	else
	{
		mapname = argv[2];
	}

	file = fopen (argv[1], "wb");
	if (file == NULL)
	{
		Printf ("Cannot write %s\n", argv[1]);
		return;
	}

	wadinfo_t header = { PWAD_ID, 12, 0 };
	wadlump_t lumps[12] = { {0, 0, {0}} };

	fseek (file, 12, SEEK_SET);
	
	lumps[0].FilePos = LittleLong(12);
	lumps[0].Size = 0;
	uppercopy (lumps[0].Name, mapname);

	APPEND(1, THINGS);
	APPEND(2, LINEDEFS);
	APPEND(3, SIDEDEFS);
	APPEND(4, VERTEXES);
	APPEND(5, SEGS);
	APPEND(6, SSECTORS);
	APPEND(7, NODES);
	APPEND(8, SECTORS);
	APPEND(9, REJECT);
	APPEND(10, BLOCKMAP);
	APPEND(11, BEHAVIOR);

	header.InfoTableOfs = ftell (file);

	fwrite (lumps, 16, 12, file);
	fseek (file, 0, SEEK_SET);
	fwrite (&header, 12, 1, file);

	fclose (file);
}